

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc8.cpp
# Opt level: O1

void __thiscall Crc8::DisplayTable(Crc8 *this)

{
  long lVar1;
  long lVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  
  iVar4 = 0;
  iVar5 = 0;
  do {
    lVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
      lVar2 = std::cout;
      *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) | 0x4000;
      lVar1 = *(long *)(lVar2 + -0x18);
      *(uint *)(std::ios_base::Init::Init + lVar1) =
           *(uint *)(std::ios_base::Init::Init + lVar1) & 0xffffffb5 | 8;
      lVar1 = *(long *)(lVar2 + -0x18);
      if (*(char *)(lVar1 + 0x10a181) == '\0') {
        uVar3 = std::ios::widen((char)lVar1 + -0x60);
        *(undefined1 *)(lVar1 + 0x10a180) = uVar3;
        *(undefined1 *)(lVar1 + 0x10a181) = 1;
      }
      *(undefined1 *)(lVar1 + 0x10a180) = 0x30;
      *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 2;
      poVar6 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,(uint)(this->crcTable)._M_elems[lVar7 + iVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 0x10);
    iVar4 = iVar4 + 0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x10);
  return;
}

Assistant:

void Crc8::DisplayTable() const
{
  int index = 0;

  for (int i = 0; i < 16; ++i)
  {
    for (int j = 0; j < 16; ++j)
    {
      std::cout << "0x" << std::uppercase << std::hex << std::setfill('0') << std::setw(2) << int(crcTable[index++]) << ", ";
    }

    std::cout << "\n";
  }
}